

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86.c
# Opt level: O1

lzma_ret x86_coder_init(lzma_next_coder *next,lzma_allocator *allocator,lzma_filter_info *filters,
                       _Bool is_encoder)

{
  lzma_ret lVar1;
  
  lVar1 = lzma_simple_coder_init(next,allocator,filters,x86_code,8,5,1,is_encoder);
  if (lVar1 == LZMA_OK) {
    **(undefined8 **)((long)next->coder + 0x58) = 0xfffffffb00000000;
  }
  return lVar1;
}

Assistant:

static lzma_ret
x86_coder_init(lzma_next_coder *next, const lzma_allocator *allocator,
		const lzma_filter_info *filters, bool is_encoder)
{
	const lzma_ret ret = lzma_simple_coder_init(next, allocator, filters,
			&x86_code, sizeof(lzma_simple_x86), 5, 1, is_encoder);

	if (ret == LZMA_OK) {
		lzma_simple_coder *coder = next->coder;
		lzma_simple_x86 *simple = coder->simple;
		simple->prev_mask = 0;
		simple->prev_pos = (uint32_t)(-5);
	}

	return ret;
}